

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t
ctrl_get_high_motion_content_screen_rtc(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *puVar2;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar2 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar2 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar2 + 1;
  }
  if ((int *)*puVar2 != (int *)0x0) {
    *(int *)*puVar2 = (ctx->ppi->cpi->rc).high_motion_content_screen_rtc;
    return AOM_CODEC_OK;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_get_high_motion_content_screen_rtc(
    aom_codec_alg_priv_t *ctx, va_list args) {
  int *arg = va_arg(args, int *);
  AV1_COMP *const cpi = ctx->ppi->cpi;
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  *arg = cpi->rc.high_motion_content_screen_rtc;
  return AOM_CODEC_OK;
}